

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OplsTorsionType.hpp
# Opt level: O3

void __thiscall
OpenMD::OplsTorsionType::OplsTorsionType
          (OplsTorsionType *this,RealType v1,RealType v2,RealType v3,bool trans180)

{
  _Rb_tree_header *p_Var1;
  DoublePolynomial *this_00;
  mapped_type_conflict *pmVar2;
  undefined7 in_register_00000031;
  mapped_type_conflict mVar3;
  key_type local_54;
  double local_50;
  mapped_type_conflict local_48;
  undefined8 uStack_40;
  double local_38;
  double local_28;
  
  p_Var1 = &(this->super_PolynomialTorsionType).polynomial_.polyPairMap_._M_t._M_impl.
            super__Rb_tree_header;
  (this->super_PolynomialTorsionType).polynomial_.polyPairMap_._M_t._M_impl.super__Rb_tree_header.
  _M_header._M_color = _S_red;
  *(_Base_ptr *)
   ((long)&(this->super_PolynomialTorsionType).polynomial_.polyPairMap_._M_t._M_impl.
           super__Rb_tree_header._M_header + 8) = (_Base_ptr)0x0;
  *(_Rb_tree_header **)
   ((long)&(this->super_PolynomialTorsionType).polynomial_.polyPairMap_._M_t._M_impl.
           super__Rb_tree_header._M_header + 0x10) = p_Var1;
  *(_Rb_tree_header **)
   ((long)&(this->super_PolynomialTorsionType).polynomial_.polyPairMap_._M_t._M_impl.
           super__Rb_tree_header._M_header + 0x18) = p_Var1;
  (this->super_PolynomialTorsionType).polynomial_.polyPairMap_._M_t._M_impl.super__Rb_tree_header.
  _M_node_count = 0;
  (this->super_PolynomialTorsionType).super_TorsionType._vptr_TorsionType =
       (_func_int **)&PTR__PolynomialTorsionType_00301a48;
  this->v1_ = v1;
  this->v2_ = v2;
  this->v3_ = v3;
  uStack_40 = 0;
  local_48 = (v3 * -3.0 + v1) * 0.5;
  if ((int)CONCAT71(in_register_00000031,trans180) == 0) {
    uStack_40 = 0x8000000000000000;
    local_48 = -local_48;
  }
  this_00 = &(this->super_PolynomialTorsionType).polynomial_;
  local_54 = 0;
  local_50 = v1;
  local_38 = v3;
  local_28 = v2;
  pmVar2 = std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>::
           operator[](&this_00->polyPairMap_,&local_54);
  *pmVar2 = (local_50 + local_38) * 0.5 + local_28;
  local_54 = 1;
  pmVar2 = std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>::
           operator[](&this_00->polyPairMap_,&local_54);
  *pmVar2 = local_48;
  local_54 = 2;
  pmVar2 = std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>::
           operator[](&this_00->polyPairMap_,&local_54);
  *pmVar2 = -local_28;
  local_54 = 3;
  pmVar2 = std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>::
           operator[](&this_00->polyPairMap_,&local_54);
  mVar3 = local_38 + local_38;
  if (!trans180) {
    mVar3 = -mVar3;
  }
  *pmVar2 = mVar3;
  return;
}

Assistant:

OplsTorsionType(RealType v1, RealType v2, RealType v3, bool trans180) :
        PolynomialTorsionType(), v1_(v1), v2_(v2), v3_(v3) {
      // convert OPLS Torsion Type to Polynomial Torsion type
      RealType c0 = v2 + 0.5 * (v1 + v3);
      RealType c1 = 0.5 * (v1 - 3.0 * v3);
      RealType c2 = -v2;
      RealType c3 = 2.0 * v3;

      if (!trans180) {
        c1 = -c1;
        c3 = -c3;
      }

      setCoefficient(0, c0);
      setCoefficient(1, c1);
      setCoefficient(2, c2);
      setCoefficient(3, c3);
    }